

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
          (UniQueue<FileTarget> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2)

{
  set<FileTarget,_std::less<FileTarget>,_std::allocator<FileTarget>_> *this_00;
  pair<std::_Rb_tree_iterator<FileTarget>,_bool> pVar1;
  undefined1 auStack_e8 [8];
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  local_a8;
  const_iterator local_88;
  iterator local_68;
  PackFormat *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  value_type local_38;
  KEY key;
  
  if (this->dirty == true) {
    cleanup(this,(EVP_PKEY_CTX *)s);
  }
  this_00 = &this->unique;
  pVar1 = std::
          _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                    ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                      *)this_00,s,s_1,s_2);
  local_38._M_data = (FileTarget *)((_Base_ptr)pVar1.first._M_node + 1);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    it._M_node = (_Map_pointer)
                 (this->
                 super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ).
                 super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_a8._M_cur =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_a8._M_first =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_a8._M_last =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_a8._M_node =
         (this->
         super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ).
         super__Deque_base<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_48 = s_2;
    local_40 = s_1;
    std::
    find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>(std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>
              ((_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)auStack_e8,
               (_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)&it._M_node,&local_a8,&local_38);
    local_88._M_cur = (_Elt_pointer)auStack_e8;
    local_88._M_first = it._M_cur;
    local_88._M_last = it._M_first;
    local_88._M_node = (_Map_pointer)it._M_last;
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::erase(&local_68,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
            ,&local_88);
    std::
    _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
    ::erase_abi_cxx11_((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,(_Base_ptr)pVar1.first._M_node);
    pVar1 = std::
            _Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                      ((_Rb_tree<FileTarget,FileTarget,std::_Identity<FileTarget>,std::less<FileTarget>,std::allocator<FileTarget>>
                        *)this_00,s,local_40,local_48);
    local_38._M_data = (FileTarget *)(pVar1.first._M_node._M_node + 1);
  }
  std::
  deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
  ::push_back(&this->
               super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ,&local_38);
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }